

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int UTF8ToUTF16(uchar *outb,int *outlen,uchar *in,int *inlen)

{
  ushort *puVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  byte *pbVar9;
  
  iVar4 = (int)outb;
  if (in == (uchar *)0x0) {
    if (*outlen < 2) {
      *outlen = 0;
      *inlen = 0;
      return 0;
    }
    outb[0] = 0xff;
    outb[1] = 0xfe;
    *outlen = 2;
    *inlen = 0;
    return 2;
  }
  if (inlen == (int *)0x0 || (outlen == (int *)0x0 || outb == (uchar *)0x0)) {
    return -1;
  }
  if (in == (uchar *)0x0) {
    *outlen = 0;
    *inlen = 0;
    return 0;
  }
  pbVar5 = in + *inlen;
  puVar1 = (ushort *)(outb + (long)(*outlen / 2) * 2);
  pbVar9 = in;
  while( true ) {
    iVar3 = (int)pbVar9;
    if (pbVar5 <= pbVar9) break;
    bVar2 = *pbVar9;
    uVar8 = (uint)bVar2;
    uVar7 = 0;
    if ((char)bVar2 < '\0') {
      if (bVar2 < 0xc0) {
LAB_0014347b:
        *outlen = (int)outb - iVar4;
        *inlen = iVar3 - (int)in;
        return -2;
      }
      uVar8 = (uint)bVar2;
      if (bVar2 < 0xe0) {
        uVar8 = uVar8 & 0x1f;
        uVar7 = 1;
      }
      else if (bVar2 < 0xf0) {
        uVar8 = uVar8 & 0xf;
        uVar7 = 2;
      }
      else {
        if (0xf7 < bVar2) goto LAB_0014347b;
        uVar8 = uVar8 & 7;
        uVar7 = 3;
      }
    }
    pbVar9 = pbVar9 + 1;
    if ((long)pbVar5 - (long)pbVar9 < (long)uVar7) break;
    while ((iVar6 = (int)uVar7, uVar7 = (ulong)(iVar6 - 1), iVar6 != 0 && (pbVar9 < pbVar5))) {
      bVar2 = *pbVar9;
      pbVar9 = pbVar9 + 1;
      if ((bVar2 & 0xc0) != 0x80) break;
      uVar8 = uVar8 << 6 | bVar2 & 0x3f;
    }
    if (uVar8 < 0x10000) {
      if (puVar1 <= outb) break;
      *(ushort *)outb = (ushort)uVar8;
      outb = (uchar *)((long)outb + 2);
    }
    else {
      if ((0x10ffff < uVar8) || (puVar1 <= (ushort *)((long)outb + 2))) break;
      *(ushort *)outb = (ushort)(uVar8 + 0xff0000 >> 10) | 0xd800;
      *(ushort *)((long)outb + 2) = (ushort)uVar8 & 0x3ff | 0xdc00;
      outb = (uchar *)((long)outb + 4);
    }
  }
  *outlen = (int)outb - iVar4;
  *inlen = iVar3 - (int)in;
  return *outlen;
}

Assistant:

static int
UTF8ToUTF16(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen)
{
    if (in == NULL) {
	/*
	 * initialization, add the Byte Order Mark for UTF-16LE
	 */
        if (*outlen >= 2) {
	    outb[0] = 0xFF;
	    outb[1] = 0xFE;
	    *outlen = 2;
	    *inlen = 0;
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
		    "Added FFFE Byte Order Mark\n");
#endif
	    return(2);
	}
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    return (UTF8ToUTF16LE(outb, outlen, in, inlen));
}